

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_fsm.cpp
# Opt level: O0

string * __thiscall
afsm::test::connection_fsm_def::transaction::simple_query::name_abi_cxx11_
          (string *__return_storage_ptr__,simple_query *this)

{
  simple_query_fsm *this_00;
  common_base *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  simple_query *local_18;
  simple_query *this_local;
  
  local_18 = this;
  this_local = (simple_query *)__return_storage_ptr__;
  this_00 = fsm(this);
  pcVar1 = detail::
           state_machine_base_with_base<afsm::test::connection_fsm_def::transaction::simple_query,_afsm::none,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
           ::current_state_base
                     ((state_machine_base_with_base<afsm::test::connection_fsm_def::transaction::simple_query,_afsm::none,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
                       *)this_00);
  (*(pcVar1->super_state_name)._vptr_state_name[2])();
  std::operator+(__return_storage_ptr__,"simple query ",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

::std::string
            name() const override
            {
                return "simple query " + fsm().current_state_base().name();
            }